

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O2

size_t __thiscall jrtplib::RTCPSDESPacket::GetItemLength(RTCPSDESPacket *this)

{
  uint8_t *puVar1;
  
  if ((((this->super_RTCPPacket).knownformat == true) &&
      (puVar1 = this->currentchunk, puVar1 != (uint8_t *)0x0)) && (puVar1[this->itemoffset] != '\0')
     ) {
    return (ulong)puVar1[this->itemoffset + 1];
  }
  return 0;
}

Assistant:

inline size_t RTCPSDESPacket::GetItemLength() const
{
	if (!knownformat)
		return None;
	if (currentchunk == 0)
		return None;
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid == 0)
		return 0;
	return (size_t)(sdeshdr->length);
}